

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t extraout_RDX;
  uint64_t Address_03;
  uint64_t Address_04;
  uint uVar3;
  uint RegNo;
  int iVar4;
  DecodeStatus DVar5;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  DVar5 = MCDisassembler_Fail;
  iVar4 = ((Insn >> 5 & 1) != 0) + 1;
  DVar1 = DecodeDPRRegisterClass(Inst,uVar3,Address,Decoder);
  if ((DVar1 | 2) == MCDisassembler_Success) {
    DVar2 = DecodeDPRRegisterClass(Inst,uVar3 + iVar4 & 0x1f,Address_00,Decoder);
    DVar5 = DVar1;
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar5 = MCDisassembler_SoftFail;
    }
    DVar1 = DecodeDPRRegisterClass(Inst,uVar3 + iVar4 * 2 & 0x1f,Address_01,Decoder);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar5 = MCDisassembler_SoftFail;
    }
    RegNo = Insn >> 0x10 & 0xf;
    uVar3 = Insn & 0xf;
    Address_03 = Address_02;
    if ((uVar3 != 0xf) &&
       (DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address_02,Decoder), Address_03 = extraout_RDX,
       DVar1 != MCDisassembler_Success)) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar5 = MCDisassembler_SoftFail;
    }
    DVar1 = DecodeGPRRegisterClass(Inst,RegNo,Address_03,Decoder);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar5 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,0);
    if (uVar3 == 0xd) {
      MCOperand_CreateReg0(Inst,0);
    }
    else if (((uVar3 != 0xf) &&
             (DVar1 = DecodeGPRRegisterClass(Inst,uVar3,Address_04,Decoder),
             DVar1 != MCDisassembler_Success)) &&
            (DVar5 = MCDisassembler_Fail, DVar1 == MCDisassembler_SoftFail)) {
      DVar5 = MCDisassembler_SoftFail;
    }
  }
  return DVar5;
}

Assistant:

static DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, inc;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 0);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}